

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Str.cpp
# Opt level: O0

void __thiscall mbc::Val::Str::Str(Str *this)

{
  string *this_00;
  allocator local_41;
  string local_40;
  anon_class_1_0_00000001 local_1d [13];
  Str *local_10;
  Str *this_local;
  
  local_10 = this;
  _ValAtom::_ValAtom(&this->super__ValAtom);
  (this->super__ValAtom).super_ValBase._vptr_ValBase = (_func_int **)&PTR__Str_00192958;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00);
  this->value_ = this_00;
  std::function<bool(std::__cxx11::string_const&)>::operator=
            ((function<bool(std::__cxx11::string_const&)> *)(this->super__ValAtom).vaild_checker_,
             local_1d);
  std::__cxx11::string::operator=
            ((string *)(this->super__ValAtom).super_ValBase.invaild_waring_,"[invaild str]");
  *(this->super__ValAtom).super_ValBase.type_ = STR;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,anon_var_dwarf_469e1 + 0xb79,&local_41);
  _ValAtom::set(&this->super__ValAtom,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

Str::Str() {
    value_           = new string();

    *vaild_checker_  = [](const string& str){return true;};
    *invaild_waring_ = "[invaild str]";
    *type_           = Type(STR);

    set("");
}